

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3StrICmp(char *zLeft,char *zRight)

{
  byte bVar1;
  long lVar2;
  uchar *b;
  uchar *a;
  
  lVar2 = 0;
  do {
    bVar1 = zLeft[lVar2];
    if (bVar1 == zRight[lVar2]) {
      if ((ulong)bVar1 == 0) {
        return 0;
      }
    }
    else if ((uint)""[bVar1] - (uint)""[(byte)zRight[lVar2]] != 0) {
      return (uint)""[bVar1] - (uint)""[(byte)zRight[lVar2]];
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3StrICmp(const char *zLeft, const char *zRight){
  unsigned char *a, *b;
  int c, x;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  for(;;){
    c = *a;
    x = *b;
    if( c==x ){
      if( c==0 ) break;
    }else{
      c = (int)UpperToLower[c] - (int)UpperToLower[x];
      if( c ) break;
    }
    a++;
    b++;
  }
  return c;
}